

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwd.c
# Opt level: O0

err_t pwdVal(int argc,char **argv)

{
  int in_EDI;
  char *unaff_retaddr;
  cmd_pwd_t pwd;
  err_t code;
  undefined4 local_4;
  
  if (in_EDI == 1) {
    local_4 = cmdStDo(0);
    if (local_4 == 0) {
      local_4 = cmdPwdRead((cmd_pwd_t *)pwd,unaff_retaddr);
      cmdPwdClose((cmd_pwd_t)0x11455e);
    }
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

static err_t pwdVal(int argc, char* argv[])
{
	err_t code = ERR_OK;
	cmd_pwd_t pwd = 0;
	// верное число параметров?
	if (argc != 1)
		return ERR_CMD_PARAMS;
	// самотестирование
	code = cmdStDo(CMD_ST_BELS | CMD_ST_BELT);
	ERR_CALL_CHECK(code);
	// определить пароль (с одновременной проверкой)
	code = cmdPwdRead(&pwd, *argv);
	cmdPwdClose(pwd);
	return code;
}